

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void PartialCRCBitByBitTest<unsigned_short,(unsigned_short)16>
               (char *data,size_t size,Parameters<unsigned_short,_(unsigned_short)16> *parameters,
               unsigned_short expectedCRC,string *crcName)

{
  unsigned_short uVar1;
  unsigned_short computedCRC;
  string *in_R9;
  bool in_stack_00000008;
  
  computedCRC = (unsigned_short)crcName;
  uVar1 = CRC::Calculate<unsigned_short,(unsigned_short)16>
                    ("123456789",4,(Parameters<unsigned_short,_(unsigned_short)16> *)data);
  uVar1 = CRC::Calculate<unsigned_short,(unsigned_short)16>
                    ("56789",5,(Parameters<unsigned_short,_(unsigned_short)16> *)data,uVar1);
  PrintResult<unsigned_short,(unsigned_short)16>
            (data,size & 0xffffffff,(Parameters<unsigned_short,_(unsigned_short)16> *)(ulong)uVar1,
             (unsigned_short)parameters,computedCRC,in_R9,in_stack_00000008);
  return;
}

Assistant:

static void PartialCRCBitByBitTest(const char * data, size_t size, const CRC::Parameters<CRCType, CRCWidth> & parameters, CRCType expectedCRC, const std::string & crcName)
{
    CRCType computedCRC = CRC::Calculate(data, size / 2, parameters);

    // Don't forget (size + 1) to round odd numbers properly!
    computedCRC = CRC::Calculate(data + (size / 2), (size + 1) / 2, parameters, computedCRC);

    PrintResult<CRCType, CRCWidth>(data, size, parameters, expectedCRC, computedCRC, crcName, true);
}